

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsapp.cc
# Opt level: O0

void __thiscall
FrobTadsApplication::FrobTadsApplication(FrobTadsApplication *this,FrobOptions *opts)

{
  FrobTadsApplication *in_RDI;
  
  in_RDI->_vptr_FrobTadsApplication = (_func_int **)&PTR___cxa_pure_virtual_0042a0a0;
  FrobOptions::FrobOptions((FrobOptions *)this,opts);
  in_RDI->fRemainingTimeout = 0;
  in_RDI->fColorsEnabled = false;
  globalApp = in_RDI;
  signal(0x1c,winResizeHandler);
  return;
}

Assistant:

FrobTadsApplication::FrobTadsApplication( const FrobOptions& opts )
: options(opts), fRemainingTimeout(0), fColorsEnabled(false)
{
    // Initialize the global pointer to us.
    globalApp = this;

    // Install our window-resize signal handler.
#if HAVE_SIGWINCH
    signal(SIGWINCH, winResizeHandler);
#endif
}